

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O0

void __thiscall
Lib::DArray<int>::initFromIterator<Lib::IterTraits<Lib::RangeIterator<int>>>
          (DArray<int> *this,IterTraits<Lib::RangeIterator<int>_> it,size_t count)

{
  bool bVar1;
  Elem EVar2;
  int *piVar3;
  long in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  DArray<int> *in_RDI;
  int *ptr;
  Elem *local_38;
  size_t local_30;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar4;
  
  uVar4 = (undefined4)((ulong)in_RSI >> 0x20);
  if (in_RCX == 0) {
    ensure((DArray<int> *)CONCAT44(in_EDX,uVar4),CONCAT44((int)in_RSI,in_stack_ffffffffffffffe0));
    local_30 = 0;
    while (bVar1 = IterTraits<Lib::RangeIterator<int>_>::hasNext
                             ((IterTraits<Lib::RangeIterator<int>_> *)0x88ab2c), bVar1) {
      expand(this,count);
      EVar2 = IterTraits<Lib::RangeIterator<int>_>::next
                        ((IterTraits<Lib::RangeIterator<int>_> *)in_RDI);
      piVar3 = operator[](in_RDI,local_30);
      *piVar3 = EVar2;
      local_30 = local_30 + 1;
    }
  }
  else {
    ensure((DArray<int> *)CONCAT44(in_EDX,uVar4),CONCAT44((int)in_RSI,in_stack_ffffffffffffffe0));
    local_38 = in_RDI->_array;
    while (bVar1 = IterTraits<Lib::RangeIterator<int>_>::hasNext
                             ((IterTraits<Lib::RangeIterator<int>_> *)0x88aae2), bVar1) {
      EVar2 = IterTraits<Lib::RangeIterator<int>_>::next
                        ((IterTraits<Lib::RangeIterator<int>_> *)in_RDI);
      *local_38 = EVar2;
      local_38 = local_38 + 1;
    }
  }
  return;
}

Assistant:

void initFromIterator(It it, size_t count=0) {
    if(count) {
      ensure(count);
      C* ptr=_array;
      while(it.hasNext()) {
	*(ptr++)=it.next();
      }
    } else {
      ensure(0);
      count=0;
      while(it.hasNext()) {
	expand(++count);
	(*this)[count-1]=it.next();
      }
    }
  }